

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

char * nifti_makebasename(char *fname)

{
  char *name;
  char *__s;
  size_t sVar1;
  size_t sVar2;
  
  name = nifti_strdup(fname);
  __s = nifti_find_file_extension(name);
  if (__s != (char *)0x0) {
    sVar1 = strlen(name);
    sVar2 = strlen(__s);
    name[sVar1 - sVar2] = '\0';
  }
  return name;
}

Assistant:

char * nifti_makebasename(const char* fname)
{
   char *basename;
   const char *ext;

   basename=nifti_strdup(fname);

   ext = nifti_find_file_extension(basename);
   if ( ext )
   {
     basename[strlen(basename)-strlen(ext)] = '\0';  /* clear out extension */
   }

   return basename;  /* in either case */
}